

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSS.cpp
# Opt level: O0

int __thiscall
NaPNStateSpace::verify
          (NaPNStateSpace *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  undefined4 *puVar2;
  NaVector *pNVar3;
  ulong uVar4;
  uint k;
  uint m;
  uint n;
  bool answer;
  bool local_23;
  bool local_22;
  bool local_21;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int local_10;
  bool local_9;
  NaPNStateSpace *local_8;
  
  local_9 = true;
  local_8 = this;
  if (this->m_pSSModel == (NaStateSpaceModel *)0x0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  (*(this->m_pSSModel->super_NaUnit).super_NaLogging._vptr_NaLogging[0x15])
            (this->m_pSSModel,&stack0xffffffffffffffe8,&stack0xffffffffffffffec,&local_10);
  local_21 = false;
  if ((local_9 & 1U) != 0) {
    pNVar3 = NaPetriCnOutput::data(&this->x);
    iVar1 = (*pNVar3->_vptr_NaVector[6])();
    local_21 = iVar1 == local_10;
  }
  local_9 = local_21;
  local_22 = false;
  if (local_21 != false) {
    pNVar3 = NaPetriCnOutput::data(&this->y);
    iVar1 = (*pNVar3->_vptr_NaVector[6])();
    local_22 = iVar1 == in_stack_ffffffffffffffec;
  }
  local_9 = local_22;
  uVar4 = 0;
  local_23 = false;
  if (local_22 != false) {
    pNVar3 = NaPetriCnInput::data
                       ((NaPetriCnInput *)
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    iVar1 = (*pNVar3->_vptr_NaVector[6])();
    local_23 = iVar1 == in_stack_ffffffffffffffe8;
    uVar4 = (ulong)CONCAT31((int3)((uint)iVar1 >> 8),local_23);
  }
  return (int)CONCAT71((int7)(uVar4 >> 8),local_23);
}

Assistant:

bool
NaPNStateSpace::verify ()
{
    bool    answer = true;
    unsigned n, m, k;

    if(NULL == m_pSSModel){
      throw(na_null_pointer);
    }

    m_pSSModel->GetDimensions(k, m, n);

    answer = answer && x.data().dim() == n;
    answer = answer && y.data().dim() == m;
    answer = answer && u.data().dim() == k;

    return answer;
}